

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

timestamp_ns_t __thiscall duckdb::StrpTimeFormat::ParseResult::ToTimestampNS(ParseResult *this)

{
  int iVar1;
  bool bVar2;
  date_t dVar3;
  int64_t right;
  ConversionException *pCVar4;
  allocator local_41;
  timestamp_t local_40;
  string local_38;
  
  if (this->is_special == true) {
    local_40.value = 0x7fffffffffffffff;
    iVar1 = (this->special).days;
    if ((long)iVar1 != 0x7fffffff) {
      if (iVar1 == -0x7fffffff) {
        local_40.value = -0x7fffffffffffffff;
      }
      else {
        local_40.value = (long)iVar1 * 86400000000000;
      }
    }
  }
  else {
    dVar3 = ToDate(this);
    right = ToTimeNS(this);
    bVar2 = TryMultiplyOperator::Operation<long,long,long>
                      ((long)dVar3.days,86400000000000,&local_40.value);
    if (!bVar2) {
      pCVar4 = (ConversionException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Date out of nanosecond range: %d-%d-%d",&local_41);
      ConversionException::ConversionException<int,int,int>
                (pCVar4,&local_38,this->data[0],this->data[1],this->data[2]);
      __cxa_throw(pCVar4,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar2 = TryAddOperator::Operation<long,long,long>(local_40.value,right,&local_40.value);
    if (!bVar2) {
      pCVar4 = (ConversionException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Overflow exception in date/time -> timestamp_ns conversion",
                 &local_41);
      ConversionException::ConversionException(pCVar4,&local_38);
      __cxa_throw(pCVar4,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return (timestamp_ns_t)local_40.value;
}

Assistant:

timestamp_ns_t StrpTimeFormat::ParseResult::ToTimestampNS() {
	timestamp_ns_t result;
	if (is_special) {
		if (special == date_t::infinity()) {
			result.value = timestamp_t::infinity().value;
		} else if (special == date_t::ninfinity()) {
			result.value = timestamp_t::ninfinity().value;
		} else {
			result.value = special.days * Interval::NANOS_PER_DAY;
		}
	} else {
		// Don't use rounded µs
		const auto date = ToDate();
		const auto time = ToTimeNS();
		if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(date.days, Interval::NANOS_PER_DAY,
		                                                               result.value)) {
			throw ConversionException("Date out of nanosecond range: %d-%d-%d", data[0], data[1], data[2]);
		}
		if (!TryAddOperator::Operation<int64_t, int64_t, int64_t>(result.value, time, result.value)) {
			throw ConversionException("Overflow exception in date/time -> timestamp_ns conversion");
		}
	}

	return result;
}